

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XercesXPath::XercesXPath
          (XercesXPath *this,XMLCh *xpathExpr,XMLStringPool *stringPool,
          XercesNamespaceResolver *scopeContext,uint emptyNamespaceId,bool isSelector,
          MemoryManager *manager)

{
  XMLCh *pXVar1;
  OutOfMemoryException *anon_var_0;
  undefined1 local_58 [8];
  CleanupType_conflict25 cleanup;
  bool isSelector_local;
  uint emptyNamespaceId_local;
  XercesNamespaceResolver *scopeContext_local;
  XMLStringPool *stringPool_local;
  XMLCh *xpathExpr_local;
  XercesXPath *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XMemory::XMemory((XMemory *)this);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesXPath_00536600;
  this->fEmptyNamespaceId = emptyNamespaceId;
  this->fExpression = (XMLCh *)0x0;
  this->fLocationPaths = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0;
  this->fMemoryManager = manager;
  JanitorMemFunCall<xercesc_4_0::XercesXPath>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XercesXPath> *)local_58,this,(MFPT)cleanUp);
  pXVar1 = XMLString::replicate(xpathExpr,this->fMemoryManager);
  this->fExpression = pXVar1;
  parseExpression(this,stringPool,scopeContext);
  if (isSelector) {
    checkForSelectedAttributes(this);
  }
  JanitorMemFunCall<xercesc_4_0::XercesXPath>::release
            ((JanitorMemFunCall<xercesc_4_0::XercesXPath> *)local_58);
  JanitorMemFunCall<xercesc_4_0::XercesXPath>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XercesXPath> *)local_58);
  return;
}

Assistant:

XercesXPath::XercesXPath(const XMLCh* const xpathExpr,
                         XMLStringPool* const stringPool,
                         XercesNamespaceResolver* const scopeContext,
                         const unsigned int emptyNamespaceId,
                         const bool isSelector,
                         MemoryManager* const manager)
    : fEmptyNamespaceId(emptyNamespaceId)
    , fExpression(0)
    , fLocationPaths(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XercesXPath::cleanUp);

    try
    {
        fExpression = XMLString::replicate(xpathExpr, fMemoryManager);
        parseExpression(stringPool, scopeContext);

        if (isSelector) {
            checkForSelectedAttributes();
        }
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}